

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DuckTransactionManager::Checkpoint
          (DuckTransactionManager *this,ClientContext *context,bool force)

{
  AttachedDatabase *db;
  StorageLockKey *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  StorageManager *this_01;
  MetaTransaction *this_02;
  InterruptException *this_03;
  TransactionException *pTVar4;
  optional_ptr<duckdb::Transaction,_true> current;
  StorageLockKey *local_70;
  string local_68;
  pthread_mutex_t *local_48;
  StorageManager *local_40;
  optional_ptr<duckdb::Transaction,_true> local_38;
  
  this_01 = AttachedDatabase::GetStorageManager((this->super_TransactionManager).db);
  bVar2 = StorageManager::InMemory(this_01);
  if (bVar2) {
    return;
  }
  db = (this->super_TransactionManager).db;
  this_02 = TransactionContext::ActiveTransaction(&context->transaction);
  local_38 = MetaTransaction::TryGetTransaction(this_02,db);
  if (local_38.ptr == (Transaction *)0x0) {
    local_70 = (StorageLockKey *)0x0;
    if (force) {
      local_48 = (pthread_mutex_t *)&this->start_transaction_lock;
      local_40 = this_01;
      iVar3 = pthread_mutex_lock(local_48);
      if (iVar3 != 0) {
        ::std::__throw_system_error(iVar3);
      }
      do {
        this_00 = local_70;
        if (((context->interrupted)._M_base._M_i & 1U) != 0) {
          this_03 = (InterruptException *)__cxa_allocate_exception(0x10);
          InterruptException::InterruptException(this_03);
          __cxa_throw(this_03,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
        }
        StorageLock::TryGetExclusiveLock((StorageLock *)&local_68);
        local_70 = (StorageLockKey *)local_68._M_dataplus._M_p;
        local_68._M_dataplus._M_p = (pointer)0x0;
        if (this_00 != (StorageLockKey *)0x0) {
          StorageLockKey::~StorageLockKey(this_00);
          operator_delete(this_00);
          _Var1._M_p = local_68._M_dataplus._M_p;
          if ((StorageLockKey *)local_68._M_dataplus._M_p != (StorageLockKey *)0x0) {
            StorageLockKey::~StorageLockKey((StorageLockKey *)local_68._M_dataplus._M_p);
            operator_delete(_Var1._M_p);
          }
        }
      } while (local_70 == (StorageLockKey *)0x0);
      pthread_mutex_unlock(local_48);
      this_01 = local_40;
      goto LAB_0066e1e5;
    }
  }
  else {
    if (force) {
      pTVar4 = (TransactionException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Cannot FORCE CHECKPOINT: the current transaction has been started for this database"
                 ,"");
      TransactionException::TransactionException(pTVar4,&local_68);
      __cxa_throw(pTVar4,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::Transaction,_true>::CheckValid(&local_38);
    bVar2 = DuckTransaction::ChangesMade((DuckTransaction *)local_38.ptr);
    if (bVar2) {
      pTVar4 = (TransactionException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,
                 "Cannot CHECKPOINT: the current transaction has transaction local changes","");
      TransactionException::TransactionException(pTVar4,&local_68);
      __cxa_throw(pTVar4,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  StorageLock::TryGetExclusiveLock((StorageLock *)&local_68);
  local_70 = (StorageLockKey *)local_68._M_dataplus._M_p;
  if ((StorageLockKey *)local_68._M_dataplus._M_p == (StorageLockKey *)0x0) {
    pTVar4 = (TransactionException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "Cannot CHECKPOINT: there are other write transactions active. Try using FORCE CHECKPOINT to wait until all active transactions are finished"
               ,"");
    TransactionException::TransactionException(pTVar4,&local_68);
    __cxa_throw(pTVar4,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_0066e1e5:
  (*this_01->_vptr_StorageManager[5])
            (this_01,context,1,
             (ulong)((this->lowest_active_start).super___atomic_base<unsigned_long>._M_i <
                    (this->last_commit).super___atomic_base<unsigned_long>._M_i));
  if (local_70 != (StorageLockKey *)0x0) {
    StorageLockKey::~StorageLockKey(local_70);
    operator_delete(local_70);
  }
  return;
}

Assistant:

void DuckTransactionManager::Checkpoint(ClientContext &context, bool force) {
	auto &storage_manager = db.GetStorageManager();
	if (storage_manager.InMemory()) {
		return;
	}

	auto current = Transaction::TryGet(context, db);
	if (current) {
		if (force) {
			throw TransactionException(
			    "Cannot FORCE CHECKPOINT: the current transaction has been started for this database");
		} else {
			auto &duck_transaction = current->Cast<DuckTransaction>();
			if (duck_transaction.ChangesMade()) {
				throw TransactionException("Cannot CHECKPOINT: the current transaction has transaction local changes");
			}
		}
	}

	unique_ptr<StorageLockKey> lock;
	if (!force) {
		// not a force checkpoint
		// try to get the checkpoint lock
		lock = checkpoint_lock.TryGetExclusiveLock();
		if (!lock) {
			// we could not manage to get the lock - cancel
			throw TransactionException("Cannot CHECKPOINT: there are other write transactions active. Try using FORCE "
			                           "CHECKPOINT to wait until all active transactions are finished");
		}

	} else {
		// force checkpoint - wait to get an exclusive lock
		// grab the start_transaction_lock to prevent new transactions from starting
		lock_guard<mutex> start_lock(start_transaction_lock);
		// wait until any active transactions are finished
		while (!lock) {
			if (context.interrupted) {
				throw InterruptException();
			}
			lock = checkpoint_lock.TryGetExclusiveLock();
		}
	}
	CheckpointOptions options;
	if (GetLastCommit() > LowestActiveStart()) {
		// we cannot do a full checkpoint if any transaction needs to read old data
		options.type = CheckpointType::CONCURRENT_CHECKPOINT;
	}
	storage_manager.CreateCheckpoint(context, options);
}